

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket_server.c
# Opt level: O0

int close_socket(socket_server *ss,request_close *request,socket_message *result)

{
  uint uVar1;
  int iVar2;
  socket *s_00;
  int type;
  socket *s;
  int id;
  socket_message *result_local;
  request_close *request_local;
  socket_server *ss_local;
  
  uVar1 = request->id;
  s_00 = ss->slot + (uVar1 & 0xffff);
  if ((s_00->type == 0) || (s_00->id != uVar1)) {
    result->id = uVar1;
    result->opaque = request->opaque;
    result->ud = 0;
    result->data = (char *)0x0;
    ss_local._4_4_ = 1;
  }
  else {
    iVar2 = send_buffer_empty(s_00);
    if ((iVar2 != 0) || (ss_local._4_4_ = send_buffer(ss,s_00,result), ss_local._4_4_ == -1)) {
      iVar2 = send_buffer_empty(s_00);
      if (iVar2 == 0) {
        s_00->type = 6;
        ss_local._4_4_ = -1;
      }
      else {
        force_close(ss,s_00,result);
        result->id = uVar1;
        result->opaque = request->opaque;
        ss_local._4_4_ = 1;
      }
    }
  }
  return ss_local._4_4_;
}

Assistant:

static int
close_socket(struct socket_server *ss, struct request_close *request, struct socket_message *result) {
	int id = request->id;
	struct socket * s = &ss->slot[HASH_ID(id)];
	if (s->type == SOCKET_TYPE_INVALID || s->id != id) {
		result->id = id;
		result->opaque = request->opaque;
		result->ud = 0;
		result->data = NULL;
		return SOCKET_CLOSE;
	}
	if (!send_buffer_empty(s)) { 
		int type = send_buffer(ss,s,result);
		if (type != -1)
			return type;
	}
	if (send_buffer_empty(s)) {
		force_close(ss,s,result);
		result->id = id;
		result->opaque = request->opaque;
		return SOCKET_CLOSE;
	}
	s->type = SOCKET_TYPE_HALFCLOSE;

	return -1;
}